

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

int llvm::APInt::tcDivide(WordType *lhs,WordType *rhs,WordType *remainder,WordType *srhs,uint parts)

{
  ulong uVar1;
  long lVar2;
  uint i;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  WordType WVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  
  if (((remainder == srhs) || (lhs == remainder)) || (lhs == srhs)) {
    __assert_fail("lhs != remainder && lhs != srhs && remainder != srhs",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x9d7,
                  "static int llvm::APInt::tcDivide(WordType *, const WordType *, WordType *, WordType *, unsigned int)"
                 );
  }
  iVar3 = parts * -0x40;
  uVar5 = parts - 1;
  while( true ) {
    iVar3 = iVar3 + 0x40;
    uVar9 = rhs[uVar5];
    if (uVar9 != 0) break;
    bVar11 = uVar5 == 0;
    uVar5 = uVar5 - 1;
    if (bVar11) {
      return 1;
    }
  }
  lVar2 = 0x3f;
  if (uVar9 != 0) {
    for (; uVar9 >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  iVar3 = (((uint)lVar2 ^ 0x3f) - iVar3 ^ 0x3f) + 1;
  if (iVar3 == 0) {
    return 1;
  }
  uVar5 = parts * 0x40 - iVar3;
  uVar9 = 1L << ((byte)uVar5 & 0x3f);
  if (parts == 0) {
    tcShiftLeft(srhs,0,uVar5);
    __assert_fail("parts > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x892,"static void llvm::APInt::tcSet(WordType *, WordType, unsigned int)");
  }
  uVar10 = uVar5 >> 6;
  uVar8 = (ulong)parts;
  uVar4 = 0;
  do {
    srhs[uVar4] = rhs[uVar4];
    uVar4 = uVar4 + 1;
  } while (uVar8 != uVar4);
  tcShiftLeft(srhs,parts,uVar5);
  uVar4 = 0;
  do {
    remainder[uVar4] = lhs[uVar4];
    uVar4 = uVar4 + 1;
  } while (uVar8 != uVar4);
  *lhs = 0;
  uVar4 = uVar8;
  if (parts != 1) {
    memset(lhs + 1,0,(ulong)(parts - 1) << 3);
  }
LAB_001824e6:
  uVar6 = uVar4 - 1;
  if (uVar4 != 0) goto code_r0x001824ec;
  goto LAB_001824f8;
code_r0x001824ec:
  uVar4 = uVar6;
  if (remainder[uVar6] != srhs[uVar6]) {
    if (srhs[uVar6] < remainder[uVar6]) {
LAB_001824f8:
      uVar4 = 0;
      bVar11 = false;
      do {
        uVar6 = remainder[uVar4];
        uVar1 = srhs[uVar4];
        if (bVar11) {
          WVar7 = ~uVar1 + uVar6;
          bVar11 = uVar6 <= WVar7;
        }
        else {
          bVar11 = uVar6 < uVar1;
          WVar7 = uVar6 - uVar1;
        }
        remainder[uVar4] = WVar7;
        uVar4 = uVar4 + 1;
      } while (uVar8 != uVar4);
      lhs[uVar10] = lhs[uVar10] | uVar9;
    }
    bVar11 = uVar5 == 0;
    uVar5 = uVar5 - 1;
    if (bVar11) {
      return 0;
    }
    uVar4 = *srhs >> 1;
    *srhs = uVar4;
    if (parts != 1) {
      uVar6 = 1;
      do {
        srhs[uVar6 - 1] = srhs[uVar6 & 0xffffffff] << 0x3f | uVar4;
        uVar4 = srhs[uVar6 & 0xffffffff] >> 1;
        srhs[uVar6] = uVar4;
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
    }
    uVar10 = uVar10 - (uVar9 < 2);
    bVar11 = uVar9 < 2;
    uVar4 = uVar8;
    uVar9 = uVar9 >> 1;
    if (bVar11) {
      uVar9 = 0x8000000000000000;
    }
  }
  goto LAB_001824e6;
}

Assistant:

int APInt::tcDivide(WordType *lhs, const WordType *rhs,
                    WordType *remainder, WordType *srhs,
                    unsigned parts) {
  assert(lhs != remainder && lhs != srhs && remainder != srhs);

  unsigned shiftCount = tcMSB(rhs, parts) + 1;
  if (shiftCount == 0)
    return true;

  shiftCount = parts * APINT_BITS_PER_WORD - shiftCount;
  unsigned n = shiftCount / APINT_BITS_PER_WORD;
  WordType mask = (WordType) 1 << (shiftCount % APINT_BITS_PER_WORD);

  tcAssign(srhs, rhs, parts);
  tcShiftLeft(srhs, parts, shiftCount);
  tcAssign(remainder, lhs, parts);
  tcSet(lhs, 0, parts);

  /* Loop, subtracting SRHS if REMAINDER is greater and adding that to
     the total.  */
  for (;;) {
    int compare = tcCompare(remainder, srhs, parts);
    if (compare >= 0) {
      tcSubtract(remainder, srhs, 0, parts);
      lhs[n] |= mask;
    }

    if (shiftCount == 0)
      break;
    shiftCount--;
    tcShiftRight(srhs, parts, 1);
    if ((mask >>= 1) == 0) {
      mask = (WordType) 1 << (APINT_BITS_PER_WORD - 1);
      n--;
    }
  }

  return false;
}